

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_lazy_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  seqStore_t *psVar8;
  int iVar9;
  U32 UVar10;
  int *piVar11;
  size_t sVar12;
  ulong uVar13;
  BYTE *pBVar14;
  seqDef *psVar15;
  uint uVar16;
  uint uVar17;
  BYTE *mEnd;
  BYTE *pBVar18;
  U32 UVar19;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  int *iend;
  uint uVar24;
  U32 UVar25;
  BYTE *litEnd;
  long lVar26;
  BYTE *litEnd_1;
  ulong uVar27;
  size_t ofbCandidate;
  BYTE *litLimit_w;
  U32 maxDistance;
  size_t local_100;
  uint local_f8;
  U32 local_f4;
  BYTE *local_f0;
  ulong local_e8;
  BYTE *local_e0;
  uint local_d4;
  ulong local_d0;
  int *local_c8;
  seqStore_t *local_c0;
  int *local_b8;
  BYTE *local_b0;
  int local_a4;
  BYTE *local_a0;
  int *local_98;
  int *local_90;
  BYTE *local_88;
  ulong local_80;
  uint local_74;
  BYTE *local_70;
  U32 *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_e0 = (ms->window).base;
  local_b0 = (ms->window).dictBase;
  uVar17 = (ms->window).dictLimit;
  local_d0 = (ulong)uVar17;
  local_d4 = (ms->cParams).minMatch;
  if (5 < local_d4) {
    local_d4 = 6;
  }
  if (local_d4 < 5) {
    local_d4 = 4;
  }
  local_74 = (ms->cParams).searchLog;
  local_f8 = 6;
  if (local_74 < 6) {
    local_f8 = local_74;
  }
  uVar22 = (ms->window).lowLimit;
  if (local_f8 < 5) {
    local_f8 = 4;
  }
  uVar2 = (ms->cParams).windowLog;
  local_b8 = (int *)CONCAT44(local_b8._4_4_,uVar2);
  local_e8 = (ulong)*rep;
  UVar25 = rep[1];
  ms->lazySkipping = 0;
  local_a0 = local_e0 + local_d0;
  piVar11 = (int *)((ulong)(local_a0 == (BYTE *)src) + (long)src);
  local_c8 = (int *)((long)src + (srcSize - 0x10));
  uVar3 = ms->nextToUpdate;
  uVar23 = (ulong)uVar3;
  uVar24 = ((int)local_c8 - (int)(local_e0 + uVar23)) + 1;
  uVar16 = 8;
  if (uVar24 < 8) {
    uVar16 = uVar24;
  }
  if (local_c8 < local_e0 + uVar23) {
    uVar16 = 0;
  }
  if (uVar3 < uVar16 + uVar3) {
    uVar13 = ms->hashSalt;
    cVar4 = (char)ms->rowHashLog;
    do {
      if (local_d4 == 5) {
        uVar21 = *(long *)(local_e0 + uVar23) * -0x30e4432345000000;
LAB_01d3d227:
        uVar24 = (uint)((uVar21 ^ uVar13) >> (0x38U - cVar4 & 0x3f));
      }
      else {
        if (local_d4 == 6) {
          uVar21 = *(long *)(local_e0 + uVar23) * -0x30e4432340650000;
          goto LAB_01d3d227;
        }
        uVar24 = (*(int *)(local_e0 + uVar23) * -0x61c8864f ^ (uint)uVar13) >>
                 (0x18U - cVar4 & 0x1f);
      }
      ms->hashCache[(uint)uVar23 & 7] = uVar24;
      uVar23 = uVar23 + 1;
    } while (uVar16 + uVar3 != uVar23);
  }
  local_f0 = (BYTE *)(srcSize + (long)src);
  local_68 = rep;
  if (piVar11 < local_c8) {
    local_88 = local_b0 + local_d0;
    local_70 = local_b0 + uVar22;
    uVar22 = 1 << ((byte)uVar2 & 0x1f);
    local_80 = (ulong)uVar22;
    local_a4 = uVar17 - 1;
    local_90 = (int *)(local_f0 + -0x20);
    iVar9 = (int)local_e0;
    local_58 = (ulong)(1 - (uVar22 + iVar9));
    local_50 = (ulong)(1 - iVar9);
    local_60 = (ulong)((uVar17 + iVar9) - 2);
    local_c0 = seqStore;
    do {
      pBVar18 = local_f0;
      iVar9 = ((int)piVar11 - (int)local_e0) + 1;
      UVar10 = (ms->window).lowLimit;
      UVar19 = iVar9 - (uint)local_80;
      if (iVar9 - UVar10 <= (uint)local_80) {
        UVar19 = UVar10;
      }
      if (ms->loadedDictEnd != 0) {
        UVar19 = UVar10;
      }
      uVar17 = iVar9 - (uint)local_e8;
      pBVar14 = local_e0;
      if (uVar17 < (uint)local_d0) {
        pBVar14 = local_b0;
      }
      local_f4 = UVar25;
      local_98 = piVar11;
      if (local_a4 - uVar17 < 3) {
LAB_01d3d3ec:
        uVar23 = 0;
      }
      else {
        uVar23 = 0;
        if ((uint)local_e8 <= iVar9 - UVar19) {
          if (*(int *)((long)piVar11 + 1) != *(int *)(pBVar14 + uVar17)) goto LAB_01d3d3ec;
          mEnd = local_f0;
          if (uVar17 < (uint)local_d0) {
            mEnd = local_88;
          }
          sVar12 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar11 + 5),(BYTE *)((long)(pBVar14 + uVar17) + 4),
                              local_f0,mEnd,local_a0);
          uVar23 = sVar12 + 4;
        }
      }
      local_100 = 999999999;
      if (local_d4 == 6) {
        if (local_f8 == 6) {
          uVar13 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)local_98,pBVar18,&local_100);
        }
        else if (local_f8 == 5) {
          uVar13 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)local_98,pBVar18,&local_100);
        }
        else {
          uVar13 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)local_98,pBVar18,&local_100);
        }
      }
      else if (local_d4 == 5) {
        if (local_f8 == 6) {
          uVar13 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)local_98,pBVar18,&local_100);
        }
        else if (local_f8 == 5) {
          uVar13 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)local_98,pBVar18,&local_100);
        }
        else {
          uVar13 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)local_98,pBVar18,&local_100);
        }
      }
      else if (local_f8 == 6) {
        uVar13 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)local_98,pBVar18,&local_100);
      }
      else if (local_f8 == 5) {
        uVar13 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)local_98,pBVar18,&local_100);
      }
      else {
        uVar13 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)local_98,pBVar18,&local_100);
      }
      uVar21 = uVar23;
      if (uVar23 < uVar13) {
        uVar21 = uVar13;
      }
      if (uVar21 < 4) {
        piVar11 = (int *)((long)local_98 + ((ulong)((long)local_98 - (long)src) >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < (ulong)((long)local_98 - (long)src));
        UVar25 = local_f4;
      }
      else {
        iend = local_98;
        uVar27 = local_100;
        if (uVar13 <= uVar23) {
          iend = (int *)((long)piVar11 + 1);
          uVar27 = 1;
        }
        if (local_98 < local_c8) {
          iVar9 = (int)local_98;
          local_38 = (ulong)(uint)((int)local_58 + iVar9);
          uVar17 = (int)local_50 + iVar9;
          local_40 = (ulong)uVar17;
          uVar22 = ((int)local_60 + (int)local_e8) - iVar9;
          local_48 = (ulong)(uVar17 - (int)local_e8);
          lVar26 = 0;
          do {
            local_b8 = (int *)((long)local_98 + lVar26 + 1);
            if (uVar27 == 0) {
              uVar27 = 0;
            }
            else {
              UVar25 = (ms->window).lowLimit;
              iVar6 = (int)lVar26;
              iVar9 = (int)local_40 + iVar6;
              UVar10 = (int)local_38 + iVar6;
              if (iVar9 - UVar25 <= (uint)local_80) {
                UVar10 = UVar25;
              }
              if (ms->loadedDictEnd != 0) {
                UVar10 = UVar25;
              }
              uVar17 = (int)local_48 + iVar6;
              pBVar18 = local_e0;
              if (uVar17 < (uint)local_d0) {
                pBVar18 = local_b0;
              }
              if (((2 < uVar22) && ((uint)local_e8 <= iVar9 - UVar10)) &&
                 (*local_b8 == *(int *)(pBVar18 + uVar17))) {
                pBVar14 = local_f0;
                if (uVar17 < (uint)local_d0) {
                  pBVar14 = local_88;
                }
                sVar12 = ZSTD_count_2segments
                                   ((BYTE *)((long)local_98 + lVar26 + 5),
                                    (BYTE *)((long)(pBVar18 + uVar17) + 4),local_f0,pBVar14,local_a0
                                   );
                if (sVar12 < 0xfffffffffffffffc) {
                  uVar17 = 0x1f;
                  if ((uint)uVar27 != 0) {
                    for (; (uint)uVar27 >> uVar17 == 0; uVar17 = uVar17 - 1) {
                    }
                  }
                  if ((int)((uVar17 ^ 0x1f) + (int)uVar21 * 3 + -0x1e) < (int)(sVar12 + 4) * 3) {
                    uVar27 = 1;
                    uVar21 = sVar12 + 4;
                    iend = local_b8;
                  }
                }
              }
            }
            local_100 = 999999999;
            if (local_d4 == 6) {
              if (local_f8 == 6) {
                uVar23 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)local_b8,local_f0,&local_100);
              }
              else if (local_f8 == 5) {
                uVar23 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)local_b8,local_f0,&local_100);
              }
              else {
                uVar23 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)local_b8,local_f0,&local_100);
              }
            }
            else if (local_d4 == 5) {
              if (local_f8 == 6) {
                uVar23 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)local_b8,local_f0,&local_100);
              }
              else if (local_f8 == 5) {
                uVar23 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)local_b8,local_f0,&local_100);
              }
              else {
                uVar23 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)local_b8,local_f0,&local_100);
              }
            }
            else if (local_f8 == 6) {
              uVar23 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)local_b8,local_f0,&local_100);
            }
            else if (local_f8 == 5) {
              uVar23 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)local_b8,local_f0,&local_100);
            }
            else {
              uVar23 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)local_b8,local_f0,&local_100);
            }
            if (uVar23 < 4) goto LAB_01d3d831;
            uVar17 = 0x1f;
            if ((uint)uVar27 != 0) {
              for (; (uint)uVar27 >> uVar17 == 0; uVar17 = uVar17 - 1) {
              }
            }
            iVar9 = 0x1f;
            if ((uint)local_100 != 0) {
              for (; (uint)local_100 >> iVar9 == 0; iVar9 = iVar9 + -1) {
              }
            }
            if ((int)uVar23 * 4 - iVar9 <= (int)((uVar17 ^ 0x1f) + (int)uVar21 * 4 + -0x1b))
            goto LAB_01d3d831;
            lVar7 = lVar26 + 1;
            lVar26 = lVar26 + 1;
            uVar22 = uVar22 - 1;
            uVar21 = uVar23;
            iend = local_b8;
            uVar27 = local_100;
          } while ((int *)((long)local_98 + lVar7) < local_c8);
          iend = (int *)((long)local_98 + lVar26);
        }
LAB_01d3d831:
        if (3 < uVar27) {
          pcVar20 = (char *)((long)iend + (3 - (long)(local_e0 + uVar27)));
          pBVar14 = local_a0;
          pBVar18 = local_e0;
          if ((uint)pcVar20 < (uint)local_d0) {
            pBVar14 = local_70;
            pBVar18 = local_b0;
          }
          if ((src < iend) && (uVar23 = (ulong)pcVar20 & 0xffffffff, pBVar14 < pBVar18 + uVar23)) {
            pBVar18 = pBVar18 + uVar23;
            do {
              piVar11 = (int *)((long)iend + -1);
              pBVar18 = pBVar18 + -1;
              if ((*(BYTE *)piVar11 != *pBVar18) ||
                 (uVar21 = uVar21 + 1, iend = piVar11, piVar11 <= src)) break;
            } while (pBVar14 < pBVar18);
          }
          local_f4 = (U32)local_e8;
          local_e8 = (ulong)((U32)uVar27 - 3);
        }
        uVar23 = (long)iend - (long)src;
        pBVar18 = local_c0->lit;
        if (local_90 < iend) {
          ZSTD_safecopyLiterals(pBVar18,(BYTE *)src,(BYTE *)iend,(BYTE *)local_90);
LAB_01d3d8eb:
          local_c0->lit = local_c0->lit + uVar23;
          psVar15 = local_c0->sequences;
          if (0xffff < uVar23) {
            local_c0->longLengthType = ZSTD_llt_literalLength;
            local_c0->longLengthPos =
                 (U32)((ulong)((long)psVar15 - (long)local_c0->sequencesStart) >> 3);
          }
        }
        else {
          uVar5 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar18 = *src;
          *(undefined8 *)(pBVar18 + 8) = uVar5;
          pBVar18 = local_c0->lit;
          if (0x10 < uVar23) {
            uVar5 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar18 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar18 + 0x18) = uVar5;
            if (0x20 < (long)uVar23) {
              lVar26 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar26 + 0x20);
                uVar5 = puVar1[1];
                pBVar14 = pBVar18 + lVar26 + 0x20;
                *(undefined8 *)pBVar14 = *puVar1;
                *(undefined8 *)(pBVar14 + 8) = uVar5;
                puVar1 = (undefined8 *)((long)src + lVar26 + 0x30);
                uVar5 = puVar1[1];
                *(undefined8 *)(pBVar14 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar14 + 0x18) = uVar5;
                lVar26 = lVar26 + 0x20;
              } while (pBVar14 + 0x20 < pBVar18 + uVar23);
            }
            goto LAB_01d3d8eb;
          }
          local_c0->lit = pBVar18 + uVar23;
          psVar15 = local_c0->sequences;
        }
        psVar15->litLength = (U16)uVar23;
        psVar15->offBase = (U32)uVar27;
        if (0xffff < uVar21 - 3) {
          local_c0->longLengthType = ZSTD_llt_matchLength;
          local_c0->longLengthPos =
               (U32)((ulong)((long)psVar15 - (long)local_c0->sequencesStart) >> 3);
        }
        psVar15->mlBase = (U16)(uVar21 - 3);
        local_c0->sequences = psVar15 + 1;
        if (ms->lazySkipping != 0) {
          uVar17 = ms->nextToUpdate;
          uVar23 = (ulong)uVar17;
          uVar22 = ((int)local_c8 - (int)(local_e0 + uVar23)) + 1;
          if (7 < uVar22) {
            uVar22 = 8;
          }
          if (local_c8 < local_e0 + uVar23) {
            uVar22 = 0;
          }
          if (uVar17 < uVar22 + uVar17) {
            uVar13 = ms->hashSalt;
            cVar4 = (char)ms->rowHashLog;
            do {
              if (local_d4 == 5) {
                uVar27 = *(long *)(local_e0 + uVar23) * -0x30e4432345000000;
LAB_01d3da66:
                UVar25 = (U32)((uVar27 ^ uVar13) >> (0x38U - cVar4 & 0x3f));
              }
              else {
                if (local_d4 == 6) {
                  uVar27 = *(long *)(local_e0 + uVar23) * -0x30e4432340650000;
                  goto LAB_01d3da66;
                }
                UVar25 = (*(int *)(local_e0 + uVar23) * -0x61c8864f ^ (uint)uVar13) >>
                         (0x18U - cVar4 & 0x1f);
              }
              ms->hashCache[(uint)uVar23 & 7] = UVar25;
              uVar23 = uVar23 + 1;
            } while (uVar22 + uVar17 != uVar23);
          }
          ms->lazySkipping = 0;
        }
        piVar11 = (int *)((long)iend + uVar21);
        src = piVar11;
        UVar25 = local_f4;
        if (piVar11 <= local_c8) {
          do {
            iVar9 = (int)piVar11 - (int)local_e0;
            UVar10 = (ms->window).lowLimit;
            UVar19 = iVar9 - (uint)local_80;
            if (iVar9 - UVar10 <= (uint)local_80) {
              UVar19 = UVar10;
            }
            uVar23 = (ulong)UVar25;
            if (ms->loadedDictEnd != 0) {
              UVar19 = UVar10;
            }
            uVar17 = iVar9 - UVar25;
            pBVar18 = local_e0;
            if (uVar17 < (uint)local_d0) {
              pBVar18 = local_b0;
            }
            UVar10 = (U32)local_e8;
            if (((local_a4 - uVar17 < 3) || (iVar9 - UVar19 < UVar25)) ||
               (*piVar11 != *(int *)(pBVar18 + uVar17))) {
              src = piVar11;
              local_e8 = local_e8 & 0xffffffff;
              break;
            }
            pBVar14 = local_f0;
            if (uVar17 < (uint)local_d0) {
              pBVar14 = local_88;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)(piVar11 + 1),(BYTE *)((long)(pBVar18 + uVar17) + 4),
                                local_f0,pBVar14,local_a0);
            psVar8 = local_c0;
            pBVar18 = local_c0->lit;
            if (local_90 < piVar11) {
              ZSTD_safecopyLiterals(pBVar18,(BYTE *)piVar11,(BYTE *)piVar11,(BYTE *)local_90);
            }
            else {
              uVar5 = *(undefined8 *)(piVar11 + 2);
              *(undefined8 *)pBVar18 = *(undefined8 *)piVar11;
              *(undefined8 *)(pBVar18 + 8) = uVar5;
            }
            psVar15 = psVar8->sequences;
            psVar15->litLength = 0;
            psVar15->offBase = 1;
            if (0xffff < sVar12 + 1) {
              psVar8->longLengthType = ZSTD_llt_matchLength;
              psVar8->longLengthPos =
                   (U32)((ulong)((long)psVar15 - (long)psVar8->sequencesStart) >> 3);
            }
            psVar15->mlBase = (U16)(sVar12 + 1);
            psVar8->sequences = psVar15 + 1;
            piVar11 = (int *)((long)piVar11 + sVar12 + 4);
            src = piVar11;
            UVar25 = UVar10;
            local_e8 = uVar23;
          } while (piVar11 <= local_c8);
        }
      }
    } while (piVar11 < local_c8);
  }
  *local_68 = (U32)local_e8;
  local_68[1] = UVar25;
  return (long)local_f0 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1);
}